

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O0

void __thiscall GGSock::Communicator::Data::~Data(Data *this)

{
  bool bVar1;
  mutex_type *in_RDI;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_128UL>
  *unaff_retaddr;
  lock_guard<std::mutex> lock;
  lock_guard<std::mutex> *in_stack_fffffffffffffff0;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffff0,in_RDI);
  (in_RDI->super___mutex_base)._M_mutex.__size[4] = '\0';
  (in_RDI->super___mutex_base)._M_mutex.__size[2] = '\0';
  (in_RDI->super___mutex_base)._M_mutex.__size[3] = '\0';
  (in_RDI->super___mutex_base)._M_mutex.__size[1] = '\0';
  anon_unknown.dwarf_7001::closeAndReset((TSocketDescriptor *)0x1337c2);
  anon_unknown.dwarf_7001::closeAndReset((TSocketDescriptor *)0x1337d1);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1337dd);
  bVar1 = std::thread::joinable((thread *)in_stack_fffffffffffffff0);
  if (bVar1) {
    std::thread::join();
  }
  std::
  map<unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>_>_>_>
  ::~map((map<unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>_>_>_>
          *)0x133817);
  std::function<void_(short)>::~function((function<void_(short)> *)0x133827);
  std::thread::~thread((thread *)0x133837);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)unaff_retaddr);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_128UL>
  ::~array(unaff_retaddr);
  return;
}

Assistant:

~Data() {
            {
                std::lock_guard<std::mutex> lock(mutex);
                isRunning = false;
                isConnected = false;
                isConnecting = false;
                isListening = false;
                ::closeAndReset(sdpeer);
                ::closeAndReset(sd);
            }

            if (worker.joinable()) {
                worker.join();
            }
        }